

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
::DescribeTo(ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
             *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  pointer *__ptr;
  ulong uVar3;
  undefined1 local_58 [16];
  pointer local_48;
  
  lVar1 = ((long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (lVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"has 1 element that ",0x13);
    MatcherBase<const_prometheus::ClientMetric::Label_&>::DescribeTo
              (&((this->matchers_).
                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super_MatcherBase<const_prometheus::ClientMetric::Label_&>,os);
    return;
  }
  if (lVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"is empty",8);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"has ",4);
  Elements((ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
            *)local_58,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  Message::GetString_abi_cxx11_((string *)(local_58 + 8),(Message *)local_58);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)local_58._8_8_,(long)local_48);
  if ((pointer)local_58._8_8_ != (pointer)&stack0xffffffffffffffc0) {
    operator_delete((void *)local_58._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," where\n",7);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_58._0_8_ !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(_func_int **)local_58._0_8_ + 8))();
  }
  if ((this->matchers_).
      super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matchers_).
      super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar1 = 0;
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"element #",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      MatcherBase<const_prometheus::ClientMetric::Label_&>::DescribeTo
                ((MatcherBase<const_prometheus::ClientMetric::Label_&> *)
                 ((long)&(((this->matchers_).
                           super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                         super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + lVar1),os
                );
      uVar3 = uVar3 + 1;
      if (uVar3 < (ulong)(((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,",\n",2);
      }
      lVar1 = lVar1 + 0x18;
    } while (uVar3 != ((long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "is empty";
    } else if (count() == 1) {
      *os << "has 1 element that ";
      matchers_[0].DescribeTo(os);
    } else {
      *os << "has " << Elements(count()) << " where\n";
      for (size_t i = 0; i != count(); ++i) {
        *os << "element #" << i << " ";
        matchers_[i].DescribeTo(os);
        if (i + 1 < count()) {
          *os << ",\n";
        }
      }
    }
  }